

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O0

bool icu_63::double_conversion::ComputeGuess(Vector<const_char> trimmed,int exponent,double *guess)

{
  bool bVar1;
  int iVar2;
  double *in_R8;
  double dVar3;
  double dVar4;
  Vector<const_char> buffer;
  Vector<const_char> trimmed_00;
  double *guess_local;
  undefined1 auStack_20 [4];
  int exponent_local;
  Vector<const_char> trimmed_local;
  
  _auStack_20 = (double_conversion *)trimmed.start_;
  trimmed_local.start_._0_4_ = trimmed.length_;
  iVar2 = Vector<const_char>::length((Vector<const_char> *)auStack_20);
  if (iVar2 == 0) {
    *guess = 0.0;
  }
  else {
    iVar2 = Vector<const_char>::length((Vector<const_char> *)auStack_20);
    if (exponent + iVar2 + -1 < 0x135) {
      iVar2 = Vector<const_char>::length((Vector<const_char> *)auStack_20);
      if (exponent + iVar2 < -0x143) {
        *guess = 0.0;
      }
      else {
        trimmed_00.length_ = exponent;
        trimmed_00.start_ = (char *)(ulong)(uint)trimmed_local.start_;
        trimmed_00._12_4_ = 0;
        bVar1 = DoubleStrtod(_auStack_20,trimmed_00,(int)guess,in_R8);
        if ((!bVar1) &&
           (buffer.length_ = (uint)trimmed_local.start_, buffer.start_ = (char *)_auStack_20,
           buffer._12_4_ = 0, bVar1 = DiyFpStrtod(buffer,exponent,guess), !bVar1)) {
          dVar3 = *guess;
          dVar4 = Double::Infinity();
          if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
            return true;
          }
          return false;
        }
      }
    }
    else {
      dVar3 = Double::Infinity();
      *guess = dVar3;
    }
  }
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}